

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCBoolean.cpp
# Opt level: O0

void Assimp::IFC::ProcessPolygonalBoundedBooleanHalfSpaceDifference
               (IfcPolygonalBoundedHalfSpace *hs,TempMesh *result,TempMesh *first_operand,
               ConversionData *conv)

{
  __tuple_element_t<0UL,_tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_> _Var1;
  __tuple_element_t<0UL,_tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_> _Var2;
  __tuple_element_t<2UL,_tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_> _Var3;
  byte bVar4;
  double dVar5;
  IfcFloat IVar6;
  size_t sVar7;
  bool bVar8;
  bool bVar9;
  IfcSurface *pIVar10;
  IfcPlane *pIVar11;
  IfcAxis2Placement3D *pIVar12;
  Lazy *this;
  IfcDirection *in_00;
  IfcCartesianPoint *in_01;
  TempMesh *this_00;
  IfcBoundedCurve *curve;
  element_type *meshout;
  element_type *peVar13;
  aiVector3t<double> *paVar14;
  size_type sVar15;
  const_iterator cVar16;
  const_reference vtcs;
  reference puVar17;
  const_reference pvVar18;
  reference pvVar19;
  double dVar20;
  ulong uVar21;
  reference pvVar22;
  reference __y;
  reference pvVar23;
  size_type sVar24;
  reference __y_00;
  __tuple_element_t<1UL,_tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_> *p_Var25;
  __tuple_element_t<1UL,_tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_> *p_Var26;
  iterator __first;
  iterator __last;
  __tuple_element_t<0UL,_tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_> *p_Var27;
  __tuple_element_t<2UL,_tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_> *p_Var28;
  double *pdVar29;
  IfcFloat IVar30;
  size_type sVar31;
  aiVector3t<double> *__return_storage_ptr__;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  double local_ac0;
  double local_a90;
  size_type local_a60;
  pointer *local_928;
  pointer *local_910;
  vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *local_8e8;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_870;
  aiVector3t<double> local_868;
  aiVector3t<double> local_850;
  aiVector3t<double> local_838;
  aiVector3t<double> local_820;
  aiVector3t<double> local_808;
  IfcFloat local_7f0;
  size_t a_4;
  aiVector3t<double> local_7d0;
  double local_7b8;
  IfcFloat tpt;
  undefined1 auStack_798 [8];
  IfcVector3 dirToThatPoint;
  aiVector3t<double> local_778;
  double local_760;
  aiVector3t<double> local_758;
  undefined1 local_740 [8];
  IfcVector3 dirAtPolyPlane;
  aiVector3t<double> local_710;
  undefined1 auStack_6f8 [8];
  IfcVector3 boundaryPlaneNormal;
  undefined1 auStack_6d8 [8];
  IfcVector3 nextBoundaryPoint;
  undefined1 auStack_6b8 [8];
  IfcVector3 currBoundaryPoint;
  size_t nextBoundaryEdgeIdx;
  IfcFloat t;
  size_t nextIntsecIdx;
  size_t currentBoundaryEdgeIdx;
  IfcVector3 startingPoint;
  size_t a_3;
  size_t numPolyPoints;
  __normal_iterator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_*,_std::vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>_>
  local_650;
  __normal_iterator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_*,_std::vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>_>
  local_648;
  __normal_iterator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_*,_std::vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>_>
  local_640;
  const_iterator local_638;
  __normal_iterator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_*,_std::vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>_>
  local_630;
  __normal_iterator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_*,_std::vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>_>
  local_628;
  const_iterator local_620;
  undefined1 auStack_618 [8];
  tuple<unsigned_long,_aiVector3t<double>,_unsigned_long> nextintsec;
  undefined1 auStack_5e8 [8];
  tuple<unsigned_long,_aiVector3t<double>,_unsigned_long> currintsec;
  IfcFloat local_5b8;
  size_t currentIntersecIdx;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> resultpoly;
  undefined1 local_590 [7];
  bool marchBackwardsOnBoundary;
  aiMatrix3x3t<double> local_578;
  undefined1 local_530 [8];
  IfcVector3 polyNormal_1;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_500;
  const_iterator local_4f8;
  value_type_conflict2 local_4ec;
  tuple<unsigned_long,_aiVector3t<double>,_unsigned_long> *local_4e8;
  __normal_iterator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_*,_std::vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>_>
  local_4e0;
  const_iterator local_4d8;
  aiVector3t<double> local_4d0;
  tuple<unsigned_long,_aiVector3t<double>,_unsigned_long> *local_4b8;
  __normal_iterator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_*,_std::vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>_>
  local_4b0;
  __normal_iterator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_*,_std::vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>_>
  local_4a8;
  __normal_iterator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_*,_std::vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>_>
  local_4a0;
  const_iterator local_498;
  __normal_iterator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_*,_std::vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>_>
  local_490;
  __normal_iterator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_*,_std::vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>_>
  local_488;
  const_iterator local_480;
  aiVector3t<double> local_478;
  ulong local_460;
  size_t a_2;
  size_t b_2;
  tuple<unsigned_long,_aiVector3t<double>,_unsigned_long> local_438;
  ulong local_410;
  size_t b_1;
  aiVector3t<double> local_3f0;
  ulong local_3d8;
  size_t b;
  undefined1 local_3c8 [7];
  bool keepSorting;
  IfcVector3 e1_1;
  IfcVector3 e0_1;
  size_t a_1;
  vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
  intersected_boundary;
  undefined1 local_370 [7];
  bool isCurrentlyInside;
  byte local_351;
  undefined1 local_350 [7];
  bool startedInside;
  vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
  intersections;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *newtrgt;
  undefined1 local_311;
  pointer *ppaStack_310;
  bool isPlaneHit;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *trgt;
  IfcVector3 ei;
  IfcVector3 e1;
  IfcVector3 e0;
  size_t a;
  byte local_299;
  iterator iStack_298;
  bool isCurrentlyOnWhiteSide;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_290;
  const_iterator local_288;
  vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *local_280;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *targetSide;
  undefined1 local_259;
  undefined1 local_258 [7];
  bool isOnWhiteSide;
  IfcVector3 polyNormal;
  size_t srcVtxCount;
  IfcVector3 *srcVertices;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> blackside;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> whiteside;
  const_iterator iit;
  const_iterator end;
  const_iterator begin;
  uint vidx;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *outvertcnt;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *outvert;
  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *in;
  IfcMatrix4 proj;
  IfcMatrix4 proj_inv;
  IfcVector3 profileNormal;
  undefined1 local_a8 [8];
  shared_ptr<Assimp::IFC::TempMesh> profile;
  ENUMERATION local_88;
  undefined1 local_60 [8];
  IfcVector3 n;
  IfcVector3 p;
  IfcPlane *plane;
  ConversionData *conv_local;
  TempMesh *first_operand_local;
  TempMesh *result_local;
  IfcPolygonalBoundedHalfSpace *hs_local;
  
  if (hs == (IfcPolygonalBoundedHalfSpace *)0x0) {
    __assert_fail("hs != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Importer/IFC/IFCBoolean.cpp"
                  ,0x187,
                  "void Assimp::IFC::ProcessPolygonalBoundedBooleanHalfSpaceDifference(const Schema_2x3::IfcPolygonalBoundedHalfSpace *, TempMesh &, const TempMesh &, ConversionData &)"
                 );
  }
  pIVar10 = STEP::Lazy<Assimp::IFC::Schema_2x3::IfcSurface>::operator->
                      ((Lazy<Assimp::IFC::Schema_2x3::IfcSurface> *)
                       &(hs->super_IfcHalfSpaceSolid).super_IfcGeometricRepresentationItem.
                        field_0x30);
  pIVar11 = STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcPlane>
                      ((Object *)
                       ((long)&(pIVar10->super_IfcGeometricRepresentationItem).
                               super_IfcRepresentationItem.
                               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                               ._vptr_ObjectHelper +
                       (long)(pIVar10->super_IfcGeometricRepresentationItem).
                             super_IfcRepresentationItem.
                             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                             ._vptr_ObjectHelper[-3]));
  if (pIVar11 == (IfcPlane *)0x0) {
    LogFunctions<Assimp::IFCImporter>::LogError
              ("expected IfcPlane as base surface for the IfcHalfSpaceSolid");
  }
  else {
    aiVector3t<double>::aiVector3t((aiVector3t<double> *)&n.z);
    aiVector3t<double>::aiVector3t((aiVector3t<double> *)local_60,0.0,0.0,1.0);
    pIVar12 = STEP::Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>::operator->
                        ((Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D> *)
                         &(pIVar11->super_IfcElementarySurface).super_IfcSurface.field_0x40);
    bVar8 = STEP::Maybe::operator_cast_to_bool((Maybe *)&(pIVar12->super_IfcPlacement).field_0x48);
    if (bVar8) {
      pIVar12 = STEP::Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>::operator->
                          ((Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D> *)
                           &(pIVar11->super_IfcElementarySurface).super_IfcSurface.field_0x40);
      this = (Lazy *)STEP::Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>_>::Get
                               ((Maybe<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcDirection>_> *
                                )&(pIVar12->super_IfcPlacement).field_0x48);
      in_00 = STEP::Lazy::operator_cast_to_IfcDirection_(this);
      ConvertDirection((IfcVector3 *)local_60,in_00);
    }
    pIVar12 = STEP::Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D>::operator->
                        ((Lazy<Assimp::IFC::Schema_2x3::IfcAxis2Placement3D> *)
                         &(pIVar11->super_IfcElementarySurface).super_IfcSurface.field_0x40);
    in_01 = STEP::Lazy::operator_cast_to_IfcCartesianPoint_
                      ((Lazy *)&(pIVar12->super_IfcPlacement).super_IfcGeometricRepresentationItem.
                                field_0x30);
    ConvertCartesianPoint((IfcVector3 *)&n.z,in_01);
    STEP::EXPRESS::ENUMERATION::ENUMERATION(&local_88,&(hs->super_IfcHalfSpaceSolid).AgreementFlag);
    bVar8 = IsTrue(&local_88);
    STEP::EXPRESS::ENUMERATION::~ENUMERATION(&local_88);
    if (((bVar8 ^ 0xffU) & 1) != 0) {
      aiVector3t<double>::operator*=((aiVector3t<double> *)local_60,-1.0);
    }
    aiVector3t<double>::Normalize((aiVector3t<double> *)local_60);
    this_00 = (TempMesh *)operator_new(0x30);
    (this_00->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this_00->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this_00->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this_00->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this_00->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this_00->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    TempMesh::TempMesh(this_00);
    std::shared_ptr<Assimp::IFC::TempMesh>::shared_ptr<Assimp::IFC::TempMesh,void>
              ((shared_ptr<Assimp::IFC::TempMesh> *)local_a8,this_00);
    curve = STEP::Lazy::operator_cast_to_IfcBoundedCurve_((Lazy *)&hs->PolygonalBoundary);
    meshout = std::__shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2>::get
                        ((__shared_ptr<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2> *)local_a8
                        );
    bVar8 = ProcessCurve(&curve->super_IfcCurve,meshout,conv);
    if (bVar8) {
      peVar13 = std::
                __shared_ptr_access<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_a8);
      paVar14 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::data
                          (&peVar13->mVerts);
      peVar13 = std::
                __shared_ptr_access<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_a8);
      sVar15 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::size
                         (&peVar13->mVerts);
      TempMesh::ComputePolygonNormal((IfcVector3 *)&proj_inv.d4,paVar14,sVar15,true);
      aiMatrix4x4t<double>::aiMatrix4x4t((aiMatrix4x4t<double> *)&proj.d4);
      pIVar12 = STEP::Lazy::operator_cast_to_IfcAxis2Placement3D_
                          ((Lazy *)&(hs->super_IfcHalfSpaceSolid).field_0x68);
      ConvertAxisPlacement((IfcMatrix4 *)&proj.d4,pIVar12);
      proj.d2 = proj_inv.d2;
      proj.d3 = proj_inv.d3;
      proj.c4 = proj_inv.c4;
      proj.d1 = proj_inv.d1;
      proj.c2 = proj_inv.c2;
      proj.c3 = proj_inv.c3;
      proj.b4 = proj_inv.b4;
      proj.c1 = proj_inv.c1;
      proj.b2 = proj_inv.b2;
      proj.b3 = proj_inv.b3;
      proj.a4 = proj_inv.a4;
      proj.b1 = proj_inv.b1;
      proj.a2 = proj_inv.a2;
      proj.a3 = proj_inv.a3;
      in = (vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)proj.d4;
      proj.a1 = proj_inv.a1;
      aiMatrix4x4t<double>::Inverse((aiMatrix4x4t<double> *)&in);
      sVar15 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::size
                         (&first_operand->mVerts);
      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
                (&result->mVerts,sVar15);
      sVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                         (&first_operand->mVertcnt);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&result->mVertcnt,sVar15);
      begin._M_current._4_4_ = 0;
      cVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         (&first_operand->mVertcnt);
      iit = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&first_operand->mVertcnt);
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
      ::__normal_iterator((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                           *)&whiteside.
                              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
      whiteside.super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage = (pointer)cVar16;
      while (bVar8 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                 *)&whiteside.
                                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&iit), bVar8)
      {
        std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::vector
                  ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                   &blackside.
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::vector
                  ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)&srcVertices)
        ;
        vtcs = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::operator[]
                         (&first_operand->mVerts,(ulong)begin._M_current._4_4_);
        puVar17 = __gnu_cxx::
                  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  ::operator*((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                               *)&whiteside.
                                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
        polyNormal.z = (double)(ulong)*puVar17;
        if (polyNormal.z != 0.0) {
          TempMesh::ComputePolygonNormal((IfcVector3 *)local_258,vtcs,(size_t)polyNormal.z,true);
          paVar14 = (aiVector3t<double> *)local_258;
          ::operator*(paVar14,(aiVector3t<double> *)local_60);
          std::abs((int)paVar14);
          if ((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) <= 0.9999) {
            ::operator-((aiVector3t<double> *)&a,vtcs,(aiVector3t<double> *)&n.z);
            dVar5 = ::operator*((aiVector3t<double> *)&a,(aiVector3t<double> *)local_60);
            local_299 = -1e-06 < dVar5;
            for (e0.z = 0.0; (ulong)e0.z < (ulong)polyNormal.z; e0.z = (double)((long)e0.z + 1)) {
              e1.z = vtcs[(long)e0.z].x;
              pvVar18 = vtcs + ((long)e0.z + 1U) % (ulong)polyNormal.z;
              ei.z = pvVar18->x;
              e1.x = pvVar18->y;
              e1.y = pvVar18->z;
              aiVector3t<double>::aiVector3t((aiVector3t<double> *)&trgt);
              if ((local_299 & 1) == 0) {
                local_910 = &srcVertices;
              }
              else {
                local_910 = &blackside.
                             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage;
              }
              ppaStack_310 = local_910;
              std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                        ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                         local_910,vtcs + (long)e0.z);
              local_311 = IntersectSegmentPlane
                                    ((IfcVector3 *)&n.z,(IfcVector3 *)local_60,(IfcVector3 *)&e1.z,
                                     (IfcVector3 *)&ei.z,(bool)(local_299 & 1),(IfcVector3 *)&trgt);
              if ((bool)local_311) {
                bVar9 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::empty
                                  ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                    *)ppaStack_310);
                bVar8 = true;
                if (!bVar9) {
                  pvVar19 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::
                            back((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *
                                 )ppaStack_310);
                  ::operator-((aiVector3t<double> *)&newtrgt,pvVar19,(aiVector3t<double> *)&trgt);
                  dVar5 = aiVector3t<double>::SquareLength((aiVector3t<double> *)&newtrgt);
                  bVar8 = 1e-12 < dVar5;
                }
                if (bVar8) {
                  std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                            ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                             ppaStack_310,(value_type *)&trgt);
                }
                local_299 = (local_299 ^ 0xff) & 1;
                if (local_299 == 0) {
                  local_928 = &srcVertices;
                }
                else {
                  local_928 = &blackside.
                               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage;
                }
                intersections.
                super__Vector_base<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_928;
                std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                          ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                           local_928,(value_type *)&trgt);
              }
            }
          }
          else {
            ::operator-((aiVector3t<double> *)&targetSide,vtcs,(aiVector3t<double> *)&n.z);
            dVar5 = ::operator*((aiVector3t<double> *)&targetSide,(aiVector3t<double> *)local_60);
            local_259 = -1e-06 < dVar5;
            if ((bool)local_259) {
              local_8e8 = (vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)
                          &blackside.
                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
            }
            else {
              local_8e8 = (vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)
                          &srcVertices;
            }
            local_280 = local_8e8;
            local_290._M_current =
                 (aiVector3t<double> *)
                 std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::end
                           ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                            local_8e8);
            __gnu_cxx::
            __normal_iterator<aiVector3t<double>const*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>
            ::__normal_iterator<aiVector3t<double>*>
                      ((__normal_iterator<aiVector3t<double>const*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>
                        *)&local_288,&local_290);
            iStack_298 = std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                         insert<aiVector3t<double>const*,void>
                                   (local_8e8,local_288,vtcs,vtcs + (long)polyNormal.z);
          }
          WritePolygon((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                       &blackside.
                        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,result);
          FilterPolygon((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                        &srcVertices);
          bVar8 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::empty
                            ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                             &srcVertices);
          if (!bVar8) {
            std::
            vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
            ::vector((vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                      *)local_350);
            pvVar19 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::front
                                ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *
                                 )&srcVertices);
            ::operator*((aiVector3t<double> *)local_370,(aiMatrix4x4t<double> *)&in,pvVar19);
            peVar13 = std::
                      __shared_ptr_access<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_a8);
            intersected_boundary.
            super__Vector_base<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
                 PointInPoly((IfcVector3 *)local_370,&peVar13->mVerts);
            local_351 = intersected_boundary.
                        super__Vector_base<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_;
            std::
            vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
            ::vector((vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
                      *)&a_1);
            for (e0_1.z = 0.0; dVar5 = e0_1.z,
                dVar20 = (double)std::
                                 vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::
                                 size((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                       *)&srcVertices), (ulong)dVar5 < (ulong)dVar20;
                e0_1.z = (double)((long)e0_1.z + 1)) {
              pvVar19 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::
                        operator[]((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                    *)&srcVertices,(size_type)e0_1.z);
              ::operator*((aiVector3t<double> *)&e1_1.z,(aiMatrix4x4t<double> *)&in,pvVar19);
              uVar21 = (long)e0_1.z + 1;
              sVar15 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::size
                                 ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                   *)&srcVertices);
              pvVar19 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::
                        operator[]((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                    *)&srcVertices,uVar21 % sVar15);
              ::operator*((aiVector3t<double> *)local_3c8,(aiMatrix4x4t<double> *)&in,pvVar19);
              std::
              vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
              ::clear((vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
                       *)&a_1);
              peVar13 = std::
                        __shared_ptr_access<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)local_a8);
              IntersectsBoundaryProfile
                        ((IfcVector3 *)&e1_1.z,(IfcVector3 *)local_3c8,&peVar13->mVerts,
                         (bool)(intersected_boundary.
                                super__Vector_base<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1),
                         (vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
                          *)&a_1,false);
              sVar15 = std::
                       vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
                       ::size((vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
                               *)&a_1);
              if (1 < sVar15) {
                b._7_1_ = 1;
                while ((b._7_1_ & 1) != 0) {
                  b._7_1_ = 0;
                  for (local_3d8 = 0; uVar21 = local_3d8,
                      sVar15 = std::
                               vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
                               ::size((vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
                                       *)&a_1), uVar21 < sVar15 - 1; local_3d8 = local_3d8 + 1) {
                    pvVar22 = std::
                              vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
                              ::operator[]((vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
                                            *)&a_1,local_3d8 + 1);
                    ::operator-(&local_3f0,&pvVar22->second,(aiVector3t<double> *)&e1_1.z);
                    dVar5 = aiVector3t<double>::SquareLength(&local_3f0);
                    pvVar22 = std::
                              vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
                              ::operator[]((vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
                                            *)&a_1,local_3d8);
                    ::operator-((aiVector3t<double> *)&b_1,&pvVar22->second,
                                (aiVector3t<double> *)&e1_1.z);
                    dVar20 = aiVector3t<double>::SquareLength((aiVector3t<double> *)&b_1);
                    if (dVar5 < dVar20) {
                      b._7_1_ = 1;
                      pvVar22 = std::
                                vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
                                ::operator[]((vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
                                              *)&a_1,local_3d8 + 1);
                      __y = std::
                            vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
                            ::operator[]((vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
                                          *)&a_1,local_3d8);
                      std::swap<unsigned_long,aiVector3t<double>>(pvVar22,__y);
                    }
                  }
                }
              }
              for (local_410 = 0; uVar21 = local_410,
                  sVar15 = std::
                           vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
                           ::size((vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
                                   *)&a_1), uVar21 < sVar15; local_410 = local_410 + 1) {
                pvVar22 = std::
                          vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
                          ::operator[]((vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
                                        *)&a_1,local_410);
                ::operator*((aiVector3t<double> *)&b_2,(aiMatrix4x4t<double> *)&proj.d4,
                            &pvVar22->second);
                pvVar22 = std::
                          vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
                          ::operator[]((vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
                                        *)&a_1,local_410);
                std::make_tuple<unsigned_long&,aiVector3t<double>,unsigned_long&>
                          (&local_438,(unsigned_long *)&e0_1.z,(aiVector3t<double> *)&b_2,
                           &pvVar22->first);
                std::
                vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                ::push_back((vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                             *)local_350,&local_438);
              }
              sVar15 = std::
                       vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
                       ::size((vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
                               *)&a_1);
              if ((sVar15 & 1) != 0) {
                intersected_boundary.
                super__Vector_base<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
                     (intersected_boundary.
                      super__Vector_base<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ ^ 0xff) & 1;
              }
            }
            sVar15 = std::
                     vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                     ::size((vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                             *)local_350);
            if ((sVar15 & 1) == 0) {
              sVar15 = std::
                       vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                       ::size((vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                               *)local_350);
              if (1 < sVar15) {
                if ((local_351 & 1) == 0) {
                  for (a_2 = 0; sVar7 = a_2,
                      sVar15 = std::
                               vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                               ::size((vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                                       *)local_350), sVar7 < sVar15 - 1; a_2 = a_2 + 1) {
                    pvVar23 = std::
                              vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                              ::operator[]((vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                                            *)local_350,a_2);
                    sVar7 = a_2;
                    sVar15 = std::
                             vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                             ::size((vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                                     *)local_350);
                    sVar24 = std::
                             vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                             ::size((vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                                     *)local_350);
                    __y_00 = std::
                             vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                             ::operator[]((vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                                           *)local_350,((sVar7 + sVar15) - 1) % sVar24);
                    std::swap<unsigned_long,aiVector3t<double>,unsigned_long>(pvVar23,__y_00);
                  }
                }
                local_460 = 0;
                while( true ) {
                  sVar15 = std::
                           vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                           ::size((vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                                   *)local_350);
                  uVar21 = local_460;
                  bVar8 = false;
                  if (sVar15 != 0) {
                    sVar15 = std::
                             vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                             ::size((vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                                     *)local_350);
                    bVar8 = uVar21 < sVar15 - 1;
                  }
                  if (!bVar8) break;
                  pvVar23 = std::
                            vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                            ::operator[]((vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                                          *)local_350,local_460);
                  p_Var25 = std::get<1ul,unsigned_long,aiVector3t<double>,unsigned_long>(pvVar23);
                  uVar21 = local_460 + 1;
                  sVar15 = std::
                           vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                           ::size((vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                                   *)local_350);
                  pvVar23 = std::
                            vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                            ::operator[]((vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                                          *)local_350,uVar21 % sVar15);
                  p_Var26 = std::get<1ul,unsigned_long,aiVector3t<double>,unsigned_long>(pvVar23);
                  ::operator-(&local_478,p_Var25,p_Var26);
                  dVar5 = aiVector3t<double>::SquareLength(&local_478);
                  if (1e-10 <= dVar5) {
                    local_460 = local_460 + 1;
                  }
                  else {
                    local_490._M_current =
                         (tuple<unsigned_long,_aiVector3t<double>,_unsigned_long> *)
                         std::
                         vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                         ::begin((vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                                  *)local_350);
                    local_488 = __gnu_cxx::
                                __normal_iterator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_*,_std::vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>_>
                                ::operator+(&local_490,local_460);
                    __gnu_cxx::
                    __normal_iterator<std::tuple<unsigned_long,aiVector3t<double>,unsigned_long>const*,std::vector<std::tuple<unsigned_long,aiVector3t<double>,unsigned_long>,std::allocator<std::tuple<unsigned_long,aiVector3t<double>,unsigned_long>>>>
                    ::__normal_iterator<std::tuple<unsigned_long,aiVector3t<double>,unsigned_long>*>
                              ((__normal_iterator<std::tuple<unsigned_long,aiVector3t<double>,unsigned_long>const*,std::vector<std::tuple<unsigned_long,aiVector3t<double>,unsigned_long>,std::allocator<std::tuple<unsigned_long,aiVector3t<double>,unsigned_long>>>>
                                *)&local_480,&local_488);
                    local_4b0._M_current =
                         (tuple<unsigned_long,_aiVector3t<double>,_unsigned_long> *)
                         std::
                         vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                         ::begin((vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                                  *)local_350);
                    local_4a8 = __gnu_cxx::
                                __normal_iterator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_*,_std::vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>_>
                                ::operator+(&local_4b0,local_460);
                    local_4a0 = __gnu_cxx::
                                __normal_iterator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_*,_std::vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>_>
                                ::operator+(&local_4a8,2);
                    __gnu_cxx::
                    __normal_iterator<std::tuple<unsigned_long,aiVector3t<double>,unsigned_long>const*,std::vector<std::tuple<unsigned_long,aiVector3t<double>,unsigned_long>,std::allocator<std::tuple<unsigned_long,aiVector3t<double>,unsigned_long>>>>
                    ::__normal_iterator<std::tuple<unsigned_long,aiVector3t<double>,unsigned_long>*>
                              ((__normal_iterator<std::tuple<unsigned_long,aiVector3t<double>,unsigned_long>const*,std::vector<std::tuple<unsigned_long,aiVector3t<double>,unsigned_long>,std::allocator<std::tuple<unsigned_long,aiVector3t<double>,unsigned_long>>>>
                                *)&local_498,&local_4a0);
                    local_4b8 = (tuple<unsigned_long,_aiVector3t<double>,_unsigned_long> *)
                                std::
                                vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                                ::erase((vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                                         *)local_350,local_480,local_498);
                  }
                }
                sVar15 = std::
                         vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                         ::size((vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                                 *)local_350);
                bVar8 = false;
                if (1 < sVar15) {
                  pvVar23 = std::
                            vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                            ::back((vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                                    *)local_350);
                  p_Var25 = std::get<1ul,unsigned_long,aiVector3t<double>,unsigned_long>(pvVar23);
                  pvVar23 = std::
                            vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                            ::front((vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                                     *)local_350);
                  p_Var26 = std::get<1ul,unsigned_long,aiVector3t<double>,unsigned_long>(pvVar23);
                  ::operator-(&local_4d0,p_Var25,p_Var26);
                  dVar5 = aiVector3t<double>::SquareLength(&local_4d0);
                  bVar8 = dVar5 < 1e-10;
                }
                if (bVar8) {
                  std::
                  vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                  ::pop_back((vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                              *)local_350);
                  local_4e0._M_current =
                       (tuple<unsigned_long,_aiVector3t<double>,_unsigned_long> *)
                       std::
                       vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                       ::begin((vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                                *)local_350);
                  __gnu_cxx::
                  __normal_iterator<std::tuple<unsigned_long,aiVector3t<double>,unsigned_long>const*,std::vector<std::tuple<unsigned_long,aiVector3t<double>,unsigned_long>,std::allocator<std::tuple<unsigned_long,aiVector3t<double>,unsigned_long>>>>
                  ::__normal_iterator<std::tuple<unsigned_long,aiVector3t<double>,unsigned_long>*>
                            ((__normal_iterator<std::tuple<unsigned_long,aiVector3t<double>,unsigned_long>const*,std::vector<std::tuple<unsigned_long,aiVector3t<double>,unsigned_long>,std::allocator<std::tuple<unsigned_long,aiVector3t<double>,unsigned_long>>>>
                              *)&local_4d8,&local_4e0);
                  local_4e8 = (tuple<unsigned_long,_aiVector3t<double>,_unsigned_long> *)
                              std::
                              vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                              ::erase((vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                                       *)local_350,local_4d8);
                }
              }
              bVar8 = std::
                      vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                      ::empty((vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                               *)local_350);
              if (!bVar8) {
                aiMatrix3x3t<double>::aiMatrix3x3t(&local_578,(aiMatrix4x4t<double> *)&in);
                paVar14 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::
                          data((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                               &srcVertices);
                sVar15 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::size
                                   ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                     *)&srcVertices);
                TempMesh::ComputePolygonNormal((IfcVector3 *)local_590,paVar14,sVar15,true);
                ::operator*((aiVector3t<double> *)local_530,&local_578,
                            (aiVector3t<double> *)local_590);
                dVar5 = ::operator*((aiVector3t<double> *)&proj_inv.d4,
                                    (aiVector3t<double> *)local_530);
                resultpoly.
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage._7_1_ = 0.0 <= dVar5;
LAB_007fb905:
                bVar8 = std::
                        vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                        ::empty((vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                                 *)local_350);
                if (((bVar8 ^ 0xffU) & 1) != 0) {
                  std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::vector
                            ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                             &currentIntersecIdx);
                  local_5b8 = 0.0;
                  do {
                    sVar15 = std::
                             vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                             ::size((vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                                     *)local_350);
                    if (sVar15 <= (long)local_5b8 + 1U) {
                      __assert_fail("intersections.size() > currentIntersecIdx + 1",
                                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Importer/IFC/IFCBoolean.cpp"
                                    ,0x26a,
                                    "void Assimp::IFC::ProcessPolygonalBoundedBooleanHalfSpaceDifference(const Schema_2x3::IfcPolygonalBoundedHalfSpace *, TempMesh &, const TempMesh &, ConversionData &)"
                                   );
                    }
                    pvVar23 = std::
                              vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                              ::operator[]((vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                                            *)local_350,(size_type)local_5b8);
                    currintsec.
                    super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                    super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                    super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.z =
                         (double)(pvVar23->
                                 super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>
                                 ).super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
                    auStack_5e8 = (undefined1  [8])
                                  (pvVar23->
                                  super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>
                                  ).super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                                  super__Tuple_impl<2UL,_unsigned_long>.
                                  super__Head_base<2UL,_unsigned_long,_false>._M_head_impl;
                    currintsec.
                    super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                    super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                    super__Tuple_impl<2UL,_unsigned_long>.
                    super__Head_base<2UL,_unsigned_long,_false>._M_head_impl =
                         (_Head_base<2UL,_unsigned_long,_false>)
                         (pvVar23->
                         super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>).
                         super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                         super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.x;
                    currintsec.
                    super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                    super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                    super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.x =
                         (pvVar23->
                         super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>).
                         super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                         super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.y;
                    currintsec.
                    super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                    super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                    super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.y =
                         (pvVar23->
                         super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>).
                         super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                         super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.z;
                    pvVar23 = std::
                              vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                              ::operator[]((vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                                            *)local_350,(long)local_5b8 + 1);
                    nextintsec.
                    super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                    super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                    super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.z =
                         (double)(pvVar23->
                                 super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>
                                 ).super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
                    auStack_618 = (undefined1  [8])
                                  (pvVar23->
                                  super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>
                                  ).super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                                  super__Tuple_impl<2UL,_unsigned_long>.
                                  super__Head_base<2UL,_unsigned_long,_false>._M_head_impl;
                    nextintsec.
                    super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                    super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                    super__Tuple_impl<2UL,_unsigned_long>.
                    super__Head_base<2UL,_unsigned_long,_false>._M_head_impl =
                         (_Head_base<2UL,_unsigned_long,_false>)
                         (pvVar23->
                         super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>).
                         super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                         super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.x;
                    nextintsec.
                    super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                    super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                    super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.x =
                         (pvVar23->
                         super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>).
                         super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                         super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.y;
                    nextintsec.
                    super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>.
                    super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                    super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.y =
                         (pvVar23->
                         super__Tuple_impl<0UL,_unsigned_long,_aiVector3t<double>,_unsigned_long>).
                         super__Tuple_impl<1UL,_aiVector3t<double>,_unsigned_long>.
                         super__Head_base<1UL,_aiVector3t<double>,_false>._M_head_impl.z;
                    local_630._M_current =
                         (tuple<unsigned_long,_aiVector3t<double>,_unsigned_long> *)
                         std::
                         vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                         ::begin((vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                                  *)local_350);
                    local_628 = __gnu_cxx::
                                __normal_iterator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_*,_std::vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>_>
                                ::operator+(&local_630,(difference_type)local_5b8);
                    __gnu_cxx::
                    __normal_iterator<std::tuple<unsigned_long,aiVector3t<double>,unsigned_long>const*,std::vector<std::tuple<unsigned_long,aiVector3t<double>,unsigned_long>,std::allocator<std::tuple<unsigned_long,aiVector3t<double>,unsigned_long>>>>
                    ::__normal_iterator<std::tuple<unsigned_long,aiVector3t<double>,unsigned_long>*>
                              ((__normal_iterator<std::tuple<unsigned_long,aiVector3t<double>,unsigned_long>const*,std::vector<std::tuple<unsigned_long,aiVector3t<double>,unsigned_long>,std::allocator<std::tuple<unsigned_long,aiVector3t<double>,unsigned_long>>>>
                                *)&local_620,&local_628);
                    local_650._M_current =
                         (tuple<unsigned_long,_aiVector3t<double>,_unsigned_long> *)
                         std::
                         vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                         ::begin((vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                                  *)local_350);
                    local_648 = __gnu_cxx::
                                __normal_iterator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_*,_std::vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>_>
                                ::operator+(&local_650,(difference_type)local_5b8);
                    local_640 = __gnu_cxx::
                                __normal_iterator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_*,_std::vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>_>
                                ::operator+(&local_648,2);
                    __gnu_cxx::
                    __normal_iterator<std::tuple<unsigned_long,aiVector3t<double>,unsigned_long>const*,std::vector<std::tuple<unsigned_long,aiVector3t<double>,unsigned_long>,std::allocator<std::tuple<unsigned_long,aiVector3t<double>,unsigned_long>>>>
                    ::__normal_iterator<std::tuple<unsigned_long,aiVector3t<double>,unsigned_long>*>
                              ((__normal_iterator<std::tuple<unsigned_long,aiVector3t<double>,unsigned_long>const*,std::vector<std::tuple<unsigned_long,aiVector3t<double>,unsigned_long>,std::allocator<std::tuple<unsigned_long,aiVector3t<double>,unsigned_long>>>>
                                *)&local_638,&local_640);
                    std::
                    vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                    ::erase((vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                             *)local_350,local_620,local_638);
                    p_Var25 = std::get<1ul,unsigned_long,aiVector3t<double>,unsigned_long>
                                        ((tuple<unsigned_long,_aiVector3t<double>,_unsigned_long> *)
                                         auStack_5e8);
                    std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                              ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                               &currentIntersecIdx,p_Var25);
                    p_Var27 = std::get<0ul,unsigned_long,aiVector3t<double>,unsigned_long>
                                        ((tuple<unsigned_long,_aiVector3t<double>,_unsigned_long> *)
                                         auStack_5e8);
                    uVar21 = *p_Var27;
                    p_Var27 = std::get<0ul,unsigned_long,aiVector3t<double>,unsigned_long>
                                        ((tuple<unsigned_long,_aiVector3t<double>,_unsigned_long> *)
                                         auStack_618);
                    if (*p_Var27 < uVar21) {
                      local_a60 = std::
                                  vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::
                                  size((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                        *)&srcVertices);
                    }
                    else {
                      local_a60 = 0;
                    }
                    p_Var27 = std::get<0ul,unsigned_long,aiVector3t<double>,unsigned_long>
                                        ((tuple<unsigned_long,_aiVector3t<double>,_unsigned_long> *)
                                         auStack_618);
                    _Var1 = *p_Var27;
                    p_Var27 = std::get<0ul,unsigned_long,aiVector3t<double>,unsigned_long>
                                        ((tuple<unsigned_long,_aiVector3t<double>,_unsigned_long> *)
                                         auStack_5e8);
                    _Var2 = *p_Var27;
                    for (startingPoint.z = 4.94065645841247e-324;
                        (ulong)startingPoint.z <= (local_a60 + _Var1) - _Var2;
                        startingPoint.z = (double)((long)startingPoint.z + 1)) {
                      p_Var27 = std::get<0ul,unsigned_long,aiVector3t<double>,unsigned_long>
                                          ((tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>
                                            *)auStack_5e8);
                      uVar21 = *p_Var27 + (long)startingPoint.z;
                      sVar15 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                               ::size((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                       *)&srcVertices);
                      pvVar19 = std::
                                vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::
                                operator[]((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                            *)&srcVertices,uVar21 % sVar15);
                      std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::
                      push_back((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                                &currentIntersecIdx,pvVar19);
                    }
                    p_Var25 = std::get<1ul,unsigned_long,aiVector3t<double>,unsigned_long>
                                        ((tuple<unsigned_long,_aiVector3t<double>,_unsigned_long> *)
                                         auStack_618);
                    std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                              ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                               &currentIntersecIdx,p_Var25);
                    p_Var25 = std::get<1ul,unsigned_long,aiVector3t<double>,unsigned_long>
                                        ((tuple<unsigned_long,_aiVector3t<double>,_unsigned_long> *)
                                         auStack_618);
                    ::operator*((aiVector3t<double> *)&currentBoundaryEdgeIdx,
                                (aiMatrix4x4t<double> *)&in,p_Var25);
                    p_Var28 = std::get<2ul,unsigned_long,aiVector3t<double>,unsigned_long>
                                        ((tuple<unsigned_long,_aiVector3t<double>,_unsigned_long> *)
                                         auStack_618);
                    _Var3 = *p_Var28;
                    bVar4 = resultpoly.
                            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1;
                    peVar13 = std::
                              __shared_ptr_access<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              ::operator->((__shared_ptr_access<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                            *)local_a8);
                    sVar15 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::
                             size(&peVar13->mVerts);
                    nextIntsecIdx = (_Var3 + (long)(int)(uint)(bVar4 != 0)) % sVar15;
                    t = -NAN;
                    do {
                      sVar7 = nextIntsecIdx;
                      if (t != -NAN) goto LAB_007fc431;
                      nextBoundaryEdgeIdx = 0x4202a05f20000000;
                      if ((resultpoly.
                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
                        local_a90 = (double)(nextIntsecIdx + 1);
                      }
                      else {
                        peVar13 = std::
                                  __shared_ptr_access<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  ::operator->((__shared_ptr_access<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                                *)local_a8);
                        sVar15 = std::
                                 vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::
                                 size(&peVar13->mVerts);
                        local_a90 = (double)(sVar7 + sVar15 + -1);
                      }
                      currBoundaryPoint.z = local_a90;
                      peVar13 = std::
                                __shared_ptr_access<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                ::operator->((__shared_ptr_access<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                              *)local_a8);
                      sVar15 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                               ::size(&peVar13->mVerts);
                      currBoundaryPoint.z = (double)((ulong)currBoundaryPoint.z % sVar15);
                      peVar13 = std::
                                __shared_ptr_access<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                ::operator->((__shared_ptr_access<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                              *)local_a8);
                      pvVar19 = std::
                                vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::
                                operator[](&peVar13->mVerts,nextIntsecIdx);
                      currBoundaryPoint.y = pvVar19->z;
                      auStack_6b8 = (undefined1  [8])pvVar19->x;
                      currBoundaryPoint.x = pvVar19->y;
                      peVar13 = std::
                                __shared_ptr_access<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                ::operator->((__shared_ptr_access<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                              *)local_a8);
                      pvVar19 = std::
                                vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::
                                operator[](&peVar13->mVerts,(size_type)currBoundaryPoint.z);
                      nextBoundaryPoint.y = pvVar19->z;
                      auStack_6d8 = (undefined1  [8])pvVar19->x;
                      nextBoundaryPoint.x = pvVar19->y;
                      std::abs((int)peVar13);
                      if (1e-05 < (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00)) {
                        currBoundaryPoint.y =
                             startingPoint.y +
                             (((double)auStack_6b8 - (double)currentBoundaryEdgeIdx) *
                             (double)local_530) / polyNormal_1.y +
                             ((currBoundaryPoint.x - startingPoint.x) * polyNormal_1.x) /
                             polyNormal_1.y;
                        nextBoundaryPoint.y =
                             startingPoint.y +
                             (((double)auStack_6d8 - (double)currentBoundaryEdgeIdx) *
                             (double)local_530) / polyNormal_1.y +
                             ((nextBoundaryPoint.x - startingPoint.x) * polyNormal_1.x) /
                             polyNormal_1.y;
                      }
                      ::operator-((aiVector3t<double> *)&dirAtPolyPlane.z,
                                  (aiVector3t<double> *)auStack_6d8,
                                  (aiVector3t<double> *)auStack_6b8);
                      operator^(&local_710,(aiVector3t<double> *)&dirAtPolyPlane.z,
                                (aiVector3t<double> *)&proj_inv.d4);
                      paVar14 = aiVector3t<double>::Normalize(&local_710);
                      boundaryPlaneNormal.y = paVar14->z;
                      auStack_6f8 = (undefined1  [8])paVar14->x;
                      boundaryPlaneNormal.x = paVar14->y;
                      operator^(&local_758,(aiVector3t<double> *)auStack_6f8,
                                (aiVector3t<double> *)local_530);
                      paVar14 = aiVector3t<double>::Normalize(&local_758);
                      local_ac0 = -1.0;
                      if ((resultpoly.
                           super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
                        local_ac0 = 1.0;
                      }
                      __return_storage_ptr__ = (aiVector3t<double> *)local_740;
                      ::operator*(__return_storage_ptr__,paVar14,local_ac0);
                      std::abs((int)__return_storage_ptr__);
                      if (1e-05 < (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01)) {
                        ::operator-(&local_778,(aiVector3t<double> *)auStack_6d8,
                                    (aiVector3t<double> *)&currentBoundaryEdgeIdx);
                        local_760 = aiVector3t<double>::Length(&local_778);
                        pdVar29 = std::min<double>((double *)&nextBoundaryEdgeIdx,&local_760);
                        nextBoundaryEdgeIdx = (size_t)*pdVar29;
                      }
                      pvVar19 = std::
                                vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::
                                front((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                       *)&currentIntersecIdx);
                      ::operator*((aiVector3t<double> *)&tpt,(aiMatrix4x4t<double> *)&in,pvVar19);
                      ::operator-((aiVector3t<double> *)auStack_798,(aiVector3t<double> *)&tpt,
                                  (aiVector3t<double> *)&currentBoundaryEdgeIdx);
                      local_7b8 = ::operator*((aiVector3t<double> *)auStack_798,
                                              (aiVector3t<double> *)local_740);
                      bVar8 = false;
                      if ((-1e-06 < local_7b8) &&
                         (bVar8 = false, local_7b8 <= (double)nextBoundaryEdgeIdx)) {
                        ::operator*((aiVector3t<double> *)&a_4,local_7b8,
                                    (aiVector3t<double> *)local_740);
                        ::operator-(&local_7d0,(aiVector3t<double> *)auStack_798,
                                    (aiVector3t<double> *)&a_4);
                        dVar5 = aiVector3t<double>::SquareLength(&local_7d0);
                        bVar8 = dVar5 < 1e-10;
                      }
                      if (bVar8) {
                        t = (IfcFloat)
                            std::
                            vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                            ::size((vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                                    *)local_350);
                        nextBoundaryEdgeIdx = (size_t)local_7b8;
                      }
                      for (local_7f0 = 0.0; IVar6 = local_7f0,
                          IVar30 = (IfcFloat)
                                   std::
                                   vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                                   ::size((vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                                           *)local_350), (ulong)IVar6 < (ulong)IVar30;
                          local_7f0 = (IfcFloat)((long)local_7f0 + 2)) {
                        pvVar23 = std::
                                  vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                                  ::operator[]((vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                                                *)local_350,(size_type)local_7f0);
                        p_Var25 = std::get<1ul,unsigned_long,aiVector3t<double>,unsigned_long>
                                            (pvVar23);
                        ::operator*(&local_820,(aiMatrix4x4t<double> *)&in,p_Var25);
                        ::operator-(&local_808,&local_820,
                                    (aiVector3t<double> *)&currentBoundaryEdgeIdx);
                        dirToThatPoint.y = local_808.z;
                        auStack_798 = (undefined1  [8])local_808.x;
                        dirToThatPoint.x = local_808.y;
                        local_7b8 = ::operator*((aiVector3t<double> *)auStack_798,
                                                (aiVector3t<double> *)local_740);
                        bVar8 = false;
                        if ((-1e-06 < local_7b8) &&
                           (bVar8 = false, local_7b8 <= (double)nextBoundaryEdgeIdx)) {
                          ::operator*(&local_850,local_7b8,(aiVector3t<double> *)local_740);
                          ::operator-(&local_838,(aiVector3t<double> *)auStack_798,&local_850);
                          dVar5 = aiVector3t<double>::SquareLength(&local_838);
                          bVar8 = dVar5 < 1e-10;
                        }
                        if (bVar8) {
                          t = local_7f0;
                          nextBoundaryEdgeIdx = (size_t)local_7b8;
                        }
                      }
                      if (t == -NAN) {
                        ::operator*(&local_868,(aiMatrix4x4t<double> *)&proj.d4,
                                    (aiVector3t<double> *)auStack_6d8);
                        std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::
                        push_back((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                   *)&currentIntersecIdx,&local_868);
                        nextIntsecIdx = (size_t)currBoundaryPoint.z;
                        currentBoundaryEdgeIdx = (size_t)auStack_6d8;
                        startingPoint.x = nextBoundaryPoint.x;
                        startingPoint.y = nextBoundaryPoint.y;
                      }
                      sVar15 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                               ::size((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                       *)&currentIntersecIdx);
                      sVar24 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                               ::size((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                       *)&srcVertices);
                      peVar13 = std::
                                __shared_ptr_access<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                ::operator->((__shared_ptr_access<Assimp::IFC::TempMesh,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                              *)local_a8);
                      sVar31 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                               ::size(&peVar13->mVerts);
                    } while (sVar15 <= sVar24 + sVar31);
                    LogFunctions<Assimp::IFCImporter>::LogError
                              (
                              "Encountered endless loop while clipping polygon against poly-bounded half space."
                              );
LAB_007fc431:
                    IVar6 = t;
                    IVar30 = (IfcFloat)
                             std::
                             vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                             ::size((vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                                     *)local_350);
                    if ((ulong)IVar30 <= (ulong)IVar6) goto LAB_007fc46f;
                    local_5b8 = t;
                  } while( true );
                }
                goto LAB_007fc49c;
              }
              if ((local_351 & 1) == 0) {
                sVar15 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::size
                                   ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                     *)&srcVertices);
                local_4ec = (value_type_conflict2)sVar15;
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                          (&result->mVertcnt,&local_4ec);
                local_500._M_current =
                     (aiVector3t<double> *)
                     std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::end
                               (&result->mVerts);
                __gnu_cxx::
                __normal_iterator<aiVector3t<double>const*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>
                ::__normal_iterator<aiVector3t<double>*>
                          ((__normal_iterator<aiVector3t<double>const*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>
                            *)&local_4f8,&local_500);
                __first = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::
                          begin((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                                &srcVertices);
                __last = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::end
                                   ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                     *)&srcVertices);
                polyNormal_1.z =
                     (double)std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
                             insert<__gnu_cxx::__normal_iterator<aiVector3t<double>*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>,void>
                                       ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>
                                         *)result,local_4f8,
                                        (__normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                                         )__first._M_current,
                                        (__normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                                         )__last._M_current);
              }
            }
            else {
              LogFunctions<Assimp::IFCImporter>::LogWarn
                        (
                        "Odd number of intersections, can\'t work with that. Omitting half space boundary check."
                        );
            }
LAB_007fc49c:
            std::
            vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
            ::~vector((vector<std::pair<unsigned_long,_aiVector3t<double>_>,_std::allocator<std::pair<unsigned_long,_aiVector3t<double>_>_>_>
                       *)&a_1);
            std::
            vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
            ::~vector((vector<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_aiVector3t<double>,_unsigned_long>_>_>
                       *)local_350);
          }
        }
        std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::~vector
                  ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)&srcVertices)
        ;
        std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::~vector
                  ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                   &blackside.
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        local_870 = __gnu_cxx::
                    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                    ::operator++((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                  *)&whiteside.
                                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
        puVar17 = __gnu_cxx::
                  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                  ::operator*(&local_870);
        begin._M_current._4_4_ = *puVar17 + begin._M_current._4_4_;
      }
      LogFunctions<Assimp::IFCImporter>::LogDebug
                (
                "generating CSG geometry by plane clipping with polygonal bounding (IfcBooleanClippingResult)"
                );
    }
    else {
      LogFunctions<Assimp::IFCImporter>::LogError
                ("expected valid polyline for boundary of boolean halfspace");
    }
    std::shared_ptr<Assimp::IFC::TempMesh>::~shared_ptr
              ((shared_ptr<Assimp::IFC::TempMesh> *)local_a8);
  }
  return;
LAB_007fc46f:
  WritePolygon((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
               &currentIntersecIdx,result);
  std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::~vector
            ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)&currentIntersecIdx
            );
  goto LAB_007fb905;
}

Assistant:

void ProcessPolygonalBoundedBooleanHalfSpaceDifference(const Schema_2x3::IfcPolygonalBoundedHalfSpace* hs, TempMesh& result,
                                                       const TempMesh& first_operand,
                                                       ConversionData& conv)
{
    ai_assert(hs != NULL);

    const Schema_2x3::IfcPlane* const plane = hs->BaseSurface->ToPtr<Schema_2x3::IfcPlane>();
    if(!plane) {
        IFCImporter::LogError("expected IfcPlane as base surface for the IfcHalfSpaceSolid");
        return;
    }

    // extract plane base position vector and normal vector
    IfcVector3 p,n(0.f,0.f,1.f);
    if (plane->Position->Axis) {
        ConvertDirection(n,plane->Position->Axis.Get());
    }
    ConvertCartesianPoint(p,plane->Position->Location);

    if(!IsTrue(hs->AgreementFlag)) {
        n *= -1.f;
    }

    n.Normalize();

    // obtain the polygonal bounding volume
    std::shared_ptr<TempMesh> profile = std::shared_ptr<TempMesh>(new TempMesh());
    if(!ProcessCurve(hs->PolygonalBoundary, *profile.get(), conv)) {
        IFCImporter::LogError("expected valid polyline for boundary of boolean halfspace");
        return;
    }

    // determine winding order by calculating the normal.
    IfcVector3 profileNormal = TempMesh::ComputePolygonNormal(profile->mVerts.data(), profile->mVerts.size());

    IfcMatrix4 proj_inv;
    ConvertAxisPlacement(proj_inv,hs->Position);

    // and map everything into a plane coordinate space so all intersection
    // tests can be done in 2D space.
    IfcMatrix4 proj = proj_inv;
    proj.Inverse();

    // clip the current contents of `meshout` against the plane we obtained from the second operand
    const std::vector<IfcVector3>& in = first_operand.mVerts;
    std::vector<IfcVector3>& outvert = result.mVerts;
    std::vector<unsigned int>& outvertcnt = result.mVertcnt;

    outvert.reserve(in.size());
    outvertcnt.reserve(first_operand.mVertcnt.size());

    unsigned int vidx = 0;
    std::vector<unsigned int>::const_iterator begin = first_operand.mVertcnt.begin();
    std::vector<unsigned int>::const_iterator end = first_operand.mVertcnt.end();
    std::vector<unsigned int>::const_iterator iit;
    for( iit = begin; iit != end; vidx += *iit++ )
    {
        // Our new approach: we cut the poly along the plane, then we intersect the part on the black side of the plane
        // against the bounding polygon. All the white parts, and the black part outside the boundary polygon, are kept.
        std::vector<IfcVector3> whiteside, blackside;

        {
            const IfcVector3* srcVertices = &in[vidx];
            const size_t srcVtxCount = *iit;
            if( srcVtxCount == 0 )
                continue;

            IfcVector3 polyNormal = TempMesh::ComputePolygonNormal(srcVertices, srcVtxCount, true);

            // if the poly is parallel to the plane, put it completely on the black or white side
            if( std::abs(polyNormal * n) > 0.9999 )
            {
                bool isOnWhiteSide = (srcVertices[0] - p) * n > -1e-6;
                std::vector<IfcVector3>& targetSide = isOnWhiteSide ? whiteside : blackside;
                targetSide.insert(targetSide.end(), srcVertices, srcVertices + srcVtxCount);
            }
            else
            {
                // otherwise start building one polygon for each side. Whenever the current line segment intersects the plane
                // we put a point there as an end of the current segment. Then we switch to the other side, put a point there, too,
                // as a beginning of the current segment, and simply continue accumulating vertices.
                bool isCurrentlyOnWhiteSide = ((srcVertices[0]) - p) * n > -1e-6;
                for( size_t a = 0; a < srcVtxCount; ++a )
                {
                    IfcVector3 e0 = srcVertices[a];
                    IfcVector3 e1 = srcVertices[(a + 1) % srcVtxCount];
                    IfcVector3 ei;

                    // put starting point to the current mesh
                    std::vector<IfcVector3>& trgt = isCurrentlyOnWhiteSide ? whiteside : blackside;
                    trgt.push_back(srcVertices[a]);

                    // if there's an intersection, put an end vertex there, switch to the other side's mesh,
                    // and add a starting vertex there, too
                    bool isPlaneHit = IntersectSegmentPlane(p, n, e0, e1, isCurrentlyOnWhiteSide, ei);
                    if( isPlaneHit )
                    {
                        if( trgt.empty() || (trgt.back() - ei).SquareLength() > 1e-12 )
                            trgt.push_back(ei);
                        isCurrentlyOnWhiteSide = !isCurrentlyOnWhiteSide;
                        std::vector<IfcVector3>& newtrgt = isCurrentlyOnWhiteSide ? whiteside : blackside;
                        newtrgt.push_back(ei);
                    }
                }
            }
        }

        // the part on the white side can be written into the target mesh right away
        WritePolygon(whiteside, result);

        // The black part is the piece we need to get rid of, but only the part of it within the boundary polygon.
        // So we now need to construct all the polygons that result from BlackSidePoly minus BoundaryPoly.
        FilterPolygon(blackside);

        // Complicated, II. We run along the polygon. a) When we're inside the boundary, we run on until we hit an
        // intersection, which means we're leaving it. We then start a new out poly there. b) When we're outside the
        // boundary, we start collecting vertices until we hit an intersection, then we run along the boundary until we hit
        // an intersection, then we switch back to the poly and run on on this one again, and so on until we got a closed
        // loop. Then we continue with the path we left to catch potential additional polys on the other side of the
        // boundary as described in a)
        if( !blackside.empty() )
        {
            // poly edge index, intersection point, edge index in boundary poly
            std::vector<std::tuple<size_t, IfcVector3, size_t> > intersections;
            bool startedInside = PointInPoly(proj * blackside.front(), profile->mVerts);
            bool isCurrentlyInside = startedInside;

            std::vector<std::pair<size_t, IfcVector3> > intersected_boundary;

            for( size_t a = 0; a < blackside.size(); ++a )
            {
                const IfcVector3 e0 = proj * blackside[a];
                const IfcVector3 e1 = proj * blackside[(a + 1) % blackside.size()];

                intersected_boundary.clear();
                IntersectsBoundaryProfile(e0, e1, profile->mVerts, isCurrentlyInside, intersected_boundary);
                // sort the hits by distance from e0 to get the correct in/out/in sequence. Manually :-( I miss you, C++11.
                if( intersected_boundary.size() > 1 )
                {
                    bool keepSorting = true;
                    while( keepSorting )
                    {
                        keepSorting = false;
                        for( size_t b = 0; b < intersected_boundary.size() - 1; ++b )
                        {
                            if( (intersected_boundary[b + 1].second - e0).SquareLength() < (intersected_boundary[b].second - e0).SquareLength() )
                            {
                                keepSorting = true;
                                std::swap(intersected_boundary[b + 1], intersected_boundary[b]);
                            }
                        }
                    }
                }
                // now add them to the list of intersections
                for( size_t b = 0; b < intersected_boundary.size(); ++b )
                    intersections.push_back(std::make_tuple(a, proj_inv * intersected_boundary[b].second, intersected_boundary[b].first));

                // and calculate our new inside/outside state
                if( intersected_boundary.size() & 1 )
                    isCurrentlyInside = !isCurrentlyInside;
            }

            // we got a list of in-out-combinations of intersections. That should be an even number of intersections, or
            // we're fucked.
            if( (intersections.size() & 1) != 0 )
            {
                IFCImporter::LogWarn("Odd number of intersections, can't work with that. Omitting half space boundary check.");
                continue;
            }

            if( intersections.size() > 1 )
            {
                // If we started outside, the first intersection is a out->in intersection. Cycle them so that it
                // starts with an intersection leaving the boundary
                if( !startedInside )
                for( size_t b = 0; b < intersections.size() - 1; ++b )
                    std::swap(intersections[b], intersections[(b + intersections.size() - 1) % intersections.size()]);

                // Filter pairs of out->in->out that lie too close to each other.
                for( size_t a = 0; intersections.size() > 0 && a < intersections.size() - 1; /**/ )
                {
                    if( (std::get<1>(intersections[a]) - std::get<1>(intersections[(a + 1) % intersections.size()])).SquareLength() < 1e-10 )
                        intersections.erase(intersections.begin() + a, intersections.begin() + a + 2);
                    else
                        a++;
                }
                if( intersections.size() > 1 && (std::get<1>(intersections.back()) - std::get<1>(intersections.front())).SquareLength() < 1e-10 )
                {
                    intersections.pop_back(); intersections.erase(intersections.begin());
                }
            }


            // no intersections at all: either completely inside the boundary, so everything gets discarded, or completely outside.
            // in the latter case we're implementional lost. I'm simply going to ignore this, so a large poly will not get any
            // holes if the boundary is smaller and does not touch it anywhere.
            if( intersections.empty() )
            {
                // starting point was outside -> everything is outside the boundary -> nothing is clipped -> add black side
                // to result mesh unchanged
                if( !startedInside )
                {
                    outvertcnt.push_back(static_cast<unsigned int>(blackside.size()));
                    outvert.insert(outvert.end(), blackside.begin(), blackside.end());
                    continue;
                }
                else
                {
                    // starting point was inside the boundary -> everything is inside the boundary -> nothing is spared from the
                    // clipping -> nothing left to add to the result mesh
                    continue;
                }
            }

            // determine the direction in which we're marching along the boundary polygon. If the src poly is faced upwards
            // and the boundary is also winded this way, we need to march *backwards* on the boundary.
            const IfcVector3 polyNormal = IfcMatrix3(proj) * TempMesh::ComputePolygonNormal(blackside.data(), blackside.size());
            bool marchBackwardsOnBoundary = (profileNormal * polyNormal) >= 0.0;

            // Build closed loops from these intersections. Starting from an intersection leaving the boundary we
            // walk along the polygon to the next intersection (which should be an IS entering the boundary poly).
            // From there we walk along the boundary until we hit another intersection leaving the boundary,
            // walk along the poly to the next IS and so on until we're back at the starting point.
            // We remove every intersection we "used up", so any remaining intersection is the start of a new loop.
            while( !intersections.empty() )
            {
                std::vector<IfcVector3> resultpoly;
                size_t currentIntersecIdx = 0;

                while( true )
                {
                    ai_assert(intersections.size() > currentIntersecIdx + 1);
                    std::tuple<size_t, IfcVector3, size_t> currintsec = intersections[currentIntersecIdx + 0];
                    std::tuple<size_t, IfcVector3, size_t> nextintsec = intersections[currentIntersecIdx + 1];
                    intersections.erase(intersections.begin() + currentIntersecIdx, intersections.begin() + currentIntersecIdx + 2);

                    // we start with an in->out intersection
                    resultpoly.push_back(std::get<1>(currintsec));
                    // climb along the polygon to the next intersection, which should be an out->in
                    size_t numPolyPoints = (std::get<0>(currintsec) > std::get<0>(nextintsec) ? blackside.size() : 0)
                        + std::get<0>(nextintsec) - std::get<0>(currintsec);
                    for( size_t a = 1; a <= numPolyPoints; ++a )
                        resultpoly.push_back(blackside[(std::get<0>(currintsec) + a) % blackside.size()]);
                    // put the out->in intersection
                    resultpoly.push_back(std::get<1>(nextintsec));

                    // generate segments along the boundary polygon that lie in the poly's plane until we hit another intersection
                    IfcVector3 startingPoint = proj * std::get<1>(nextintsec);
                    size_t currentBoundaryEdgeIdx = (std::get<2>(nextintsec) + (marchBackwardsOnBoundary ? 1 : 0)) % profile->mVerts.size();
                    size_t nextIntsecIdx = SIZE_MAX;
                    while( nextIntsecIdx == SIZE_MAX )
                    {
                        IfcFloat t = 1e10;

                        size_t nextBoundaryEdgeIdx = marchBackwardsOnBoundary ? (currentBoundaryEdgeIdx + profile->mVerts.size() - 1) : currentBoundaryEdgeIdx + 1;
                        nextBoundaryEdgeIdx %= profile->mVerts.size();
                        // vertices of the current boundary segments
                        IfcVector3 currBoundaryPoint = profile->mVerts[currentBoundaryEdgeIdx];
                        IfcVector3 nextBoundaryPoint = profile->mVerts[nextBoundaryEdgeIdx];
                        // project the two onto the polygon
                        if( std::abs(polyNormal.z) > 1e-5 )
                        {
                            currBoundaryPoint.z = startingPoint.z + (currBoundaryPoint.x - startingPoint.x) * polyNormal.x/polyNormal.z + (currBoundaryPoint.y - startingPoint.y) * polyNormal.y/polyNormal.z;
                            nextBoundaryPoint.z = startingPoint.z + (nextBoundaryPoint.x - startingPoint.x) * polyNormal.x/polyNormal.z + (nextBoundaryPoint.y - startingPoint.y) * polyNormal.y/polyNormal.z;
                        }

                        // build a direction that goes along the boundary border but lies in the poly plane
                        IfcVector3 boundaryPlaneNormal = ((nextBoundaryPoint - currBoundaryPoint) ^ profileNormal).Normalize();
                        IfcVector3 dirAtPolyPlane = (boundaryPlaneNormal ^ polyNormal).Normalize() * (marchBackwardsOnBoundary ? -1.0 : 1.0);
                        // if we can project the direction to the plane, we can calculate a maximum marching distance along that dir
                        // until we finish that boundary segment and continue on the next
                        if( std::abs(polyNormal.z) > 1e-5 )
                        {
                            t = std::min(t, (nextBoundaryPoint - startingPoint).Length());
                        }

                        // check if the direction hits the loop start - if yes, we got a poly to output
                        IfcVector3 dirToThatPoint = proj * resultpoly.front() - startingPoint;
                        IfcFloat tpt = dirToThatPoint * dirAtPolyPlane;
                        if( tpt > -1e-6 && tpt <= t && (dirToThatPoint - tpt * dirAtPolyPlane).SquareLength() < 1e-10 )
                        {
                            nextIntsecIdx = intersections.size(); // dirty hack to end marching along the boundary and signal the end of the loop
                            t = tpt;
                        }

                        // also check if the direction hits any in->out intersections earlier. If we hit one, we can switch back
                        // to marching along the poly border from that intersection point
                        for( size_t a = 0; a < intersections.size(); a += 2 )
                        {
                            dirToThatPoint = proj * std::get<1>(intersections[a]) - startingPoint;
                            tpt = dirToThatPoint * dirAtPolyPlane;
                            if( tpt > -1e-6 && tpt <= t && (dirToThatPoint - tpt * dirAtPolyPlane).SquareLength() < 1e-10 )
                            {
                                nextIntsecIdx = a; // switch back to poly and march on from this in->out intersection
                                t = tpt;
                            }
                        }

                        // if we keep marching on the boundary, put the segment end point to the result poly and well... keep marching
                        if( nextIntsecIdx == SIZE_MAX )
                        {
                            resultpoly.push_back(proj_inv * nextBoundaryPoint);
                            currentBoundaryEdgeIdx = nextBoundaryEdgeIdx;
                            startingPoint = nextBoundaryPoint;
                        }

                        // quick endless loop check
                        if( resultpoly.size() > blackside.size() + profile->mVerts.size() )
                        {
                            IFCImporter::LogError("Encountered endless loop while clipping polygon against poly-bounded half space.");
                            break;
                        }
                    }

                    // we're back on the poly - if this is the intersection we started from, we got a closed loop.
                    if( nextIntsecIdx >= intersections.size() )
                    {
                        break;
                    }

                    // otherwise it's another intersection. Continue marching from there.
                    currentIntersecIdx = nextIntsecIdx;
                }

                WritePolygon(resultpoly, result);
            }
        }
    }
    IFCImporter::LogDebug("generating CSG geometry by plane clipping with polygonal bounding (IfcBooleanClippingResult)");
}